

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O3

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  cmdline_parser_arg_type arg_type;
  option *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char **ppcVar9;
  void *pvVar10;
  size_t sVar11;
  int *piVar12;
  char **ppcVar13;
  char *pcVar14;
  uint *puVar15;
  uint *field_given;
  uint uVar16;
  char *pcVar17;
  custom_getopt_data *pcVar18;
  char cVar19;
  uint uVar20;
  short string_arg;
  custom_getopt_data *pcVar21;
  custom_getopt_data *pcVar22;
  char *pcVar23;
  double *field;
  generic_list **list;
  cmdline_parser_arg_type arg_type_00;
  option *in_R9;
  option *poVar24;
  size_t sVar25;
  ulong uVar26;
  char cVar27;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  uint local_2ac;
  option *local_278;
  generic_list *molFraction_list;
  generic_list *shellRadius_list;
  int local_260;
  int local_25c;
  char **local_258;
  double *local_250;
  uint *local_248;
  uint *local_240;
  char **local_238;
  double *local_230;
  uint *local_228;
  uint *local_220;
  char **local_218;
  double *local_210;
  uint *local_208;
  uint *local_200;
  char **local_1f8;
  double *local_1f0;
  uint *local_1e8;
  uint *local_1e0;
  char **local_1d8;
  double *local_1d0;
  uint *local_1c8;
  uint *local_1c0;
  char **local_1b8;
  double *local_1b0;
  uint *local_1a8;
  uint *local_1a0;
  char **local_198;
  char **local_190;
  uint *local_188;
  uint *local_180;
  option *local_178;
  custom_getopt_data *local_170;
  gengetopt_args_info local_168;
  
  shellRadius_list = (generic_list *)0x0;
  molFraction_list = (generic_list *)0x0;
  package_name = *argv;
  arg_type = params->override;
  local_25c = params->check_required;
  uVar20 = params->check_ambiguity;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  arg_type_00 = (cmdline_parser_arg_type)in_R9;
  local_168.vacancyPercent_given = 0;
  local_168.vacancyInnerRadius_given = 0;
  local_168.vacancyOuterRadius_given = 0;
  local_168.radius_given = 0;
  local_168.length_given = 0;
  local_168.shellRadius_given = 0;
  local_168.molFraction_given = 0;
  local_168.help_given = 0;
  local_168.version_given = 0;
  local_168.output_given = 0;
  local_168.latticeConstant_given = 0;
  local_168.latticeConstant_orig = (char *)0x0;
  local_168.radius_orig = (char *)0x0;
  local_168.length_orig = (char *)0x0;
  local_168.vacancyPercent_orig = (char *)0x0;
  local_168.vacancyInnerRadius_orig = (char *)0x0;
  local_168.vacancyOuterRadius_orig = (char *)0x0;
  local_168.output_arg = (char *)0x0;
  local_168.output_orig = (char *)0x0;
  local_168.shellRadius_arg = (double *)0x0;
  local_168.shellRadius_orig = (char **)0x0;
  local_168.molFraction_arg = (double *)0x0;
  local_168.molFraction_orig = (char **)0x0;
  local_168.help_help = gengetopt_args_info_help[0];
  local_168.version_help = gengetopt_args_info_help[1];
  local_168.output_help = gengetopt_args_info_help[2];
  local_168.latticeConstant_help = gengetopt_args_info_help[3];
  local_168.radius_help = gengetopt_args_info_help[4];
  local_168.length_help = gengetopt_args_info_help[5];
  local_168.shellRadius_help = gengetopt_args_info_help[6];
  local_168.shellRadius_min = 0;
  local_168.shellRadius_max = 0;
  local_168.molFraction_help = gengetopt_args_info_help[7];
  local_168.molFraction_min = 0;
  local_168.molFraction_max = 0;
  local_168.vacancyPercent_help = gengetopt_args_info_help[8];
  local_168.vacancyInnerRadius_help = gengetopt_args_info_help[9];
  local_168.vacancyOuterRadius_help = gengetopt_args_info_help[10];
  local_168.inputs = (char **)0x0;
  local_168.inputs_num = 0;
  custom_opterr = params->print_errors;
  pcVar21 = (custom_getopt_data *)(ulong)(uint)custom_opterr;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 0;
  iVar7 = 0;
  if (argc < 1) {
LAB_0012e148:
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    update_multiple_arg(&args_info->shellRadius_arg,&args_info->shellRadius_orig,
                        args_info->shellRadius_given,local_168.shellRadius_given,
                        &shellRadius_list->arg,arg_type_00,
                        (generic_list *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    update_multiple_arg(&args_info->molFraction_arg,&args_info->molFraction_orig,
                        args_info->molFraction_given,local_168.molFraction_given,
                        &molFraction_list->arg,arg_type_00,
                        (generic_list *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    uVar20 = local_168.shellRadius_given;
    local_168.shellRadius_given = 0;
    uVar1 = args_info->shellRadius_given;
    uVar2 = args_info->molFraction_given;
    args_info->shellRadius_given = uVar1 + uVar20;
    args_info->molFraction_given = uVar2 + local_168.molFraction_given;
    local_168.molFraction_given = 0;
    if (local_25c == 0) {
      cmdline_parser_release(&local_168);
    }
    else {
      iVar6 = cmdline_parser_required2(args_info,*argv,additional_error);
      cmdline_parser_release(&local_168);
      if (iVar6 != 0) {
        return 1;
      }
    }
    iVar6 = 0;
    uVar20 = argc - iVar7;
    if (uVar20 != 0 && iVar7 <= argc) {
      args_info->inputs_num = uVar20;
      ppcVar13 = (char **)malloc((ulong)uVar20 * 8);
      args_info->inputs = ppcVar13;
      iVar6 = 0;
      uVar26 = 0;
      do {
        pcVar14 = gengetopt_strdup(argv[(long)iVar7 + uVar26]);
        args_info->inputs[uVar26] = pcVar14;
        uVar26 = uVar26 + 1;
      } while (uVar20 != uVar26);
    }
  }
  else {
    local_248 = &args_info->vacancyOuterRadius_given;
    local_240 = &local_168.vacancyOuterRadius_given;
    local_228 = &args_info->vacancyInnerRadius_given;
    local_220 = &local_168.vacancyInnerRadius_given;
    local_208 = &args_info->vacancyPercent_given;
    local_200 = &local_168.vacancyPercent_given;
    local_1e8 = &args_info->length_given;
    local_1e0 = &local_168.length_given;
    local_1c8 = &args_info->radius_given;
    local_1c0 = &local_168.radius_given;
    local_1a8 = &args_info->latticeConstant_given;
    local_1a0 = &local_168.latticeConstant_given;
    local_188 = &args_info->output_given;
    local_180 = &local_168.output_given;
    local_250 = &args_info->vacancyOuterRadius_arg;
    local_258 = &args_info->vacancyOuterRadius_orig;
    local_230 = &args_info->vacancyInnerRadius_arg;
    local_238 = &args_info->vacancyInnerRadius_orig;
    local_210 = &args_info->vacancyPercent_arg;
    local_218 = &args_info->vacancyPercent_orig;
    local_1f0 = &args_info->length_arg;
    local_1f8 = &args_info->length_orig;
    local_1d0 = &args_info->radius_arg;
    local_1d8 = &args_info->radius_orig;
    local_1b0 = &args_info->latticeConstant_arg;
    local_1b8 = &args_info->latticeConstant_orig;
    local_190 = &args_info->output_arg;
    local_198 = &args_info->output_orig;
    ppcVar13 = argv;
    pcVar14 = additional_error;
LAB_0012d90c:
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
       ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012d974:
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        exchange(argv,pcVar21);
      }
      arg_type_00 = (cmdline_parser_arg_type)in_R9;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
        ppcVar9 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        while ((**ppcVar9 != '-' || ((*ppcVar9)[1] == '\0'))) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          ppcVar9 = ppcVar9 + 1;
          if (argc == _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            piVar12 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
            goto LAB_0012e122;
          }
        }
      }
      iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 != argc) {
        lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar18 = (custom_getopt_data *)argv[lVar8];
        if ((char)pcVar18->custom_optind == '-') {
          cVar27 = *(char *)((long)&pcVar18->custom_optind + 1);
          if (cVar27 == '-') {
            if (*(char *)((long)&pcVar18->custom_optind + 2) == '\0') {
              iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
              iVar6 = iVar7;
              if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
                exchange(argv,pcVar21);
                iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
                iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar6;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
              piVar12 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
LAB_0012e122:
              *piVar12 = argc;
              iVar7 = argc;
              goto LAB_0012e127;
            }
          }
          else if (cVar27 == '\0') goto LAB_0012e485;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar18->custom_optind + (ulong)(cVar27 == '-') + 1);
          additional_error = pcVar14;
          goto LAB_0012da54;
        }
LAB_0012e485:
        iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar18;
        goto LAB_0012e4a2;
      }
LAB_0012e127:
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      goto LAB_0012e148;
    }
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
       ((char)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0'))
    goto LAB_0012d974;
    lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    additional_error = pcVar14;
LAB_0012da54:
    pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    pcVar14 = argv[lVar8];
    in_stack_fffffffffffffd3c = (uint)pcVar21;
    if (pcVar14[1] == '-') {
      for (sVar25 = 0;
          (cVar27 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                     custom_optind + sVar25), cVar27 != '\0' && (cVar27 != '='));
          sVar25 = sVar25 + 1) {
      }
      local_2ac = 0xffffffff;
      pcVar23 = (char *)0x0;
      pcVar17 = "help";
      iVar6 = 0;
      local_278 = (option *)0x0;
      poVar24 = cmdline_parser_internal::long_options;
      iVar5 = iVar6;
      poVar4 = poVar24;
      pcVar21 = (custom_getopt_data *)pcVar23;
      do {
        while( true ) {
          local_170 = pcVar21;
          local_178 = poVar4;
          local_260 = iVar5;
          uVar16 = (uint)pcVar23;
          pcVar22 = pcVar18;
          iVar5 = strncmp(pcVar17,(char *)pcVar18,sVar25);
          if (iVar5 != 0) break;
          poVar24 = poVar24 + 1;
          do {
            sVar11 = strlen(pcVar17);
            uVar16 = (uint)pcVar23;
            if ((int)sVar11 == (int)sVar25) {
              local_278 = poVar24 + -1;
              argv = ppcVar13;
              goto LAB_0012dc51;
            }
            if (local_278 == (option *)0x0) {
              local_2ac = (uint)local_170;
              local_278 = local_178;
              poVar24 = local_178;
              iVar6 = local_260;
              uVar16 = local_2ac;
              goto LAB_0012dc0c;
            }
            if (((local_278->has_arg == poVar24[-1].has_arg) &&
                (local_278->flag == poVar24[-1].flag)) && (local_278->val == poVar24[-1].val)) {
              poVar24 = poVar24 + -1;
              goto LAB_0012dc0c;
            }
            pcVar17 = poVar24->name;
            if (pcVar17 == (char *)0x0) goto LAB_0012e254;
            pcVar23 = (char *)(ulong)(uVar16 + 1);
            pcVar22 = pcVar18;
            iVar5 = strncmp(pcVar17,(char *)pcVar18,sVar25);
            poVar24 = poVar24 + 1;
            iVar6 = 1;
          } while (iVar5 == 0);
          pcVar23 = (char *)(ulong)(uVar16 + 2);
          pcVar17 = poVar24->name;
          iVar5 = local_260;
          poVar4 = local_178;
          pcVar21 = local_170;
          if (pcVar17 == (char *)0x0) goto LAB_0012e254;
        }
LAB_0012dc0c:
        pcVar17 = poVar24[1].name;
        poVar24 = poVar24 + 1;
        pcVar23 = (char *)(ulong)(uVar16 + 1);
        iVar5 = iVar6;
        poVar4 = poVar24;
        pcVar21 = (custom_getopt_data *)pcVar23;
      } while (pcVar17 != (char *)0x0);
      if (iVar6 != 0) {
LAB_0012e254:
        pcVar23 = (char *)pcVar22;
        if (in_stack_fffffffffffffd3c != 0) {
          pcVar23 = "%s: option `%s\' is ambiguous\n";
          fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*ppcVar13,pcVar14);
          pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        sVar25 = strlen((char *)pcVar18);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
             (custom_getopt_data *)((long)&pcVar18->custom_optind + sVar25);
LAB_0012e26d:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
        pcVar14 = pcVar23;
        goto LAB_0012e27e;
      }
      pcVar23 = (char *)(ulong)local_2ac;
      argv = ppcVar13;
      if (local_278 == (option *)0x0) {
        if (in_stack_fffffffffffffd3c != 0) {
          pcVar23 = "%s: unrecognized option `--%s\'\n";
          fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*ppcVar13,pcVar18);
          iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x29f3c3;
        goto LAB_0012e26d;
      }
LAB_0012dc51:
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
      if (*(char *)((long)&pcVar18->custom_optind + sVar25) == '\0') {
        if (local_278->has_arg == 1) {
          if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            if (in_stack_fffffffffffffd3c != 0) {
              pcVar23 = "%s: option `%s\' requires an argument\n";
              fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar14);
              pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            }
            goto LAB_0012e3b5;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
               (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 2;
        }
      }
      else {
        if (local_278->has_arg == 0) {
          pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          if (in_stack_fffffffffffffd3c != 0) {
            if (pcVar14[1] == '-') {
              pcVar23 = "%s: option `--%s\' doesn\'t allow an argument\n";
              fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                      local_278->name);
              pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            }
            else {
              pcVar23 = "%s: option `%c%s\' doesn\'t allow an argument\n";
              fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                      (ulong)(uint)(int)*pcVar14,local_278->name);
              pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            }
          }
LAB_0012e3b5:
          sVar25 = strlen((char *)pcVar18);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar18->custom_optind + sVar25);
          pcVar14 = pcVar23;
          goto LAB_0012e27e;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
             (custom_getopt_data *)((long)&pcVar18->custom_optind + sVar25 + 1);
      }
      iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      cVar27 = -9;
      pcVar14 = pcVar23;
      in_R9 = local_278;
      ppcVar13 = argv;
      sVar25 = strlen((char *)pcVar18);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
           (custom_getopt_data *)((long)&pcVar18->custom_optind + sVar25);
      uVar16 = local_278->val;
      iVar5 = (int)pcVar23;
      if ((uint *)local_278->flag == (uint *)0x0) goto LAB_0012dd9a;
      *local_278->flag = uVar16;
      iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012de35:
      pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      pcVar14 = cmdline_parser_internal::long_options[iVar5].name;
      iVar5 = 0x292dbb;
      cVar27 = 'Y';
      custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      in_stack_fffffffffffffd3c = custom_opterr;
      iVar6 = strcmp(pcVar14,"latticeConstant");
      puVar15 = local_1a0;
      field_given = local_1a8;
      ppcVar9 = local_1b8;
      field = local_1b0;
      if (iVar6 == 0) {
LAB_0012dfa8:
        in_R9 = (option *)0x2;
        pcVar14 = additional_error;
        iVar6 = update_arg(field,ppcVar9,field_given,puVar15,(char *)pcVar18,(char **)0x2,
                           (char *)(ulong)uVar20,arg_type,0,0,iVar5,0x2d,additional_error,cVar27,
                           (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
      else {
        iVar5 = 0x29cee2;
        cVar27 = 's';
        iVar6 = strcmp(pcVar14,"radius");
        puVar15 = local_1c0;
        field_given = local_1c8;
        ppcVar9 = local_1d8;
        field = local_1d0;
        if (iVar6 == 0) goto LAB_0012dfa8;
        iVar5 = 0x29a02f;
        cVar27 = -0x73;
        iVar6 = strcmp(pcVar14,"length");
        puVar15 = local_1e0;
        field_given = local_1e8;
        ppcVar9 = local_1f8;
        field = local_1f0;
        if (iVar6 == 0) goto LAB_0012dfa8;
        pcVar17 = "shellRadius";
        iVar6 = strcmp(pcVar14,"shellRadius");
        if (iVar6 == 0) {
          list = &shellRadius_list;
          puVar15 = &local_168.shellRadius_given;
        }
        else {
          pcVar17 = "molFraction";
          iVar6 = strcmp(pcVar14,"molFraction");
          if (iVar6 != 0) {
            iVar5 = 0x292de3;
            cVar27 = -0x25;
            iVar6 = strcmp(pcVar14,"vacancyPercent");
            puVar15 = local_200;
            field_given = local_208;
            ppcVar9 = local_218;
            field = local_210;
            if (iVar6 != 0) {
              iVar5 = 0x292df2;
              cVar27 = -0xb;
              iVar6 = strcmp(pcVar14,"vacancyInnerRadius");
              puVar15 = local_220;
              field_given = local_228;
              ppcVar9 = local_238;
              field = local_230;
              if (iVar6 != 0) {
                cVar27 = '\x0f';
                iVar6 = strcmp(pcVar14,"vacancyOuterRadius");
                if (iVar6 != 0) {
                  pcVar21 = (custom_getopt_data *)(ulong)in_stack_fffffffffffffd3c;
                  pcVar14 = additional_error;
                  goto LAB_0012dfc9;
                }
                iVar5 = 0x292e05;
                puVar15 = local_240;
                field_given = local_248;
                ppcVar9 = local_258;
                field = local_250;
              }
            }
            goto LAB_0012dfa8;
          }
          list = &molFraction_list;
          puVar15 = &local_168.molFraction_given;
        }
        pcVar14 = additional_error;
        iVar6 = update_multiple_arg_temp
                          (list,puVar15,(char *)pcVar18,(char **)pcVar17,additional_error,
                           (cmdline_parser_arg_type)in_R9,
                           (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           (char)ppcVar13,additional_error);
      }
      pcVar21 = (custom_getopt_data *)(ulong)in_stack_fffffffffffffd3c;
      if (iVar6 != 0) goto LAB_0012e28c;
LAB_0012dfc9:
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
      custom_opterr = (int)pcVar21;
      custom_optarg = (char *)pcVar18;
      goto LAB_0012d90c;
    }
    pcVar21 = (custom_getopt_data *)
              ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
    cVar19 = (char)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
    uVar16 = (uint)cVar19;
    pcVar14 = (char *)(ulong)uVar16;
    cVar27 = -0x4e;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21;
    argv = ppcVar13;
    pvVar10 = memchr("hVo:",uVar16,5);
    if (*(char *)((long)&pcVar18->custom_optind + 1) == '\0') {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
      iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if ((pvVar10 != (void *)0x0) && (cVar19 != ':')) {
      iVar5 = 0;
      ppcVar13 = argv;
      if (*(char *)((long)pvVar10 + 1) == ':') {
        cVar3 = (char)pcVar21->custom_optind;
        if (*(char *)((long)pvVar10 + 2) == ':') {
          if (cVar3 == '\0') {
            pcVar21 = (custom_getopt_data *)0x0;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
            iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
        }
        else {
          if (cVar3 == '\0') {
            if (iVar7 == argc) {
              cVar19 = '?';
              if (in_stack_fffffffffffffd3c != 0) {
                pcVar14 = "%s: option requires an argument -- %c\n";
                cVar27 = '\r';
                fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar16);
                iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              }
            }
            else {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   (custom_getopt_data *)argv[iVar7];
              iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            }
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7 + 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
            iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          iVar5 = 0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
          uVar16 = (uint)cVar19;
        }
      }
LAB_0012dd9a:
      pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      arg_type_00 = (cmdline_parser_arg_type)in_R9;
      custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      pcVar21 = (custom_getopt_data *)(ulong)(uint)custom_opterr;
      iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if ((int)uVar16 < 0x3f) {
        if (uVar16 == 0) goto LAB_0012de35;
        if (uVar16 == 0xffffffff) goto LAB_0012e148;
LAB_0012e4a2:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar6;
        custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        cmdline_parser_internal();
      }
      else {
        if (0x6e < (int)uVar16) {
          if (uVar16 != 0x6f) goto LAB_0012e4a2;
          in_R9 = (option *)0x1;
          pcVar14 = additional_error;
          iVar6 = update_arg(local_190,local_198,local_188,local_180,
                             (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,
                             (char **)0x1,(char *)(ulong)uVar20,arg_type,0,0,0x292db4,0x6f,
                             additional_error,cVar27,
                             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          if (iVar6 == 0) goto LAB_0012dfc9;
          goto LAB_0012e28c;
        }
        pcVar21 = (custom_getopt_data *)pcVar14;
        if (uVar16 == 0x3f) goto LAB_0012e28c;
        if (uVar16 != 0x56) {
          if (uVar16 == 0x68) {
            cmdline_parser_print_help();
            goto LAB_0012e4b3;
          }
          goto LAB_0012e4a2;
        }
      }
      cmdline_parser_print_version();
LAB_0012e4b3:
      cmdline_parser_free(&local_168);
      exit(0);
    }
    if (in_stack_fffffffffffffd3c != 0) {
      pcVar14 = "%s: invalid option -- %c\n";
      fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar16);
    }
LAB_0012e27e:
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    pcVar21 = (custom_getopt_data *)pcVar14;
LAB_0012e28c:
    string_arg = (short)pcVar21;
    free_list(shellRadius_list,string_arg);
    free_list(molFraction_list,string_arg);
    cmdline_parser_release(&local_168);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * shellRadius_list = NULL;
  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "latticeConstant",	1, NULL, 0 },
        { "radius",	1, NULL, 0 },
        { "length",	1, NULL, 0 },
        { "shellRadius",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "vacancyPercent",	1, NULL, 0 },
        { "vacancyInnerRadius",	1, NULL, 0 },
        { "vacancyOuterRadius",	1, NULL, 0 },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* Lattice spacing in Angstroms for cubic lattice..  */
          if (strcmp (long_options[option_index].name, "latticeConstant") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->latticeConstant_arg), 
                 &(args_info->latticeConstant_orig), &(args_info->latticeConstant_given),
                &(local_args_info.latticeConstant_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "latticeConstant", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod radius in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "radius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->radius_arg), 
                 &(args_info->radius_orig), &(args_info->radius_given),
                &(local_args_info.radius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "radius", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod length in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "length") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->length_arg), 
                 &(args_info->length_orig), &(args_info->length_given),
                &(local_args_info.length_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "length", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius containing within it only molecules of a specific component. Specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "shellRadius") == 0)
          {
          
            if (update_multiple_arg_temp(&shellRadius_list, 
                &(local_args_info.shellRadius_given), optarg, 0, 0, ARG_DOUBLE,
                "shellRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Builds a multi-component random alloy nanoparticle. A mole Fraction must be specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          /* Percentage of atoms to remove from within vacancy range.  */
          else if (strcmp (long_options[option_index].name, "vacancyPercent") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyPercent_arg), 
                 &(args_info->vacancyPercent_orig), &(args_info->vacancyPercent_given),
                &(local_args_info.vacancyPercent_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyPercent", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyInnerRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyInnerRadius_arg), 
                 &(args_info->vacancyInnerRadius_orig), &(args_info->vacancyInnerRadius_given),
                &(local_args_info.vacancyInnerRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyInnerRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyOuterRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyOuterRadius_arg), 
                 &(args_info->vacancyOuterRadius_orig), &(args_info->vacancyOuterRadius_given),
                &(local_args_info.vacancyOuterRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyOuterRadius", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->shellRadius_arg),
    &(args_info->shellRadius_orig), args_info->shellRadius_given,
    local_args_info.shellRadius_given, 0,
    ARG_DOUBLE, shellRadius_list);
  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->shellRadius_given += local_args_info.shellRadius_given;
  local_args_info.shellRadius_given = 0;
  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (shellRadius_list, 0 );
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}